

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_to_bytes(wally_psbt *psbt,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  wally_psbt_input *pwVar1;
  long lVar2;
  wally_psbt_output *pwVar3;
  int iVar4;
  size_t *psVar5;
  wally_psbt *pwVar6;
  size_t sVar7;
  undefined1 *puVar8;
  size_t *size;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  size_t max;
  uchar *cursor;
  size_t remaining;
  uchar *ptr;
  uchar buff [1024];
  undefined1 local_482;
  byte local_481;
  size_t local_480;
  uchar *local_478;
  size_t *local_470;
  wally_psbt *local_468;
  ulong local_460;
  size_t *local_458;
  size_t *local_450;
  size_t local_448;
  size_t *local_440;
  size_t local_438 [129];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar4 = -2;
  if ((flags == 0 && written != (size_t *)0x0) && (iVar4 = -2, psbt != (wally_psbt *)0x0)) {
    local_481 = psbt->magic[4] != 0xff || *(int *)psbt->magic != 0x74657370;
    local_480 = len;
    local_478 = bytes_out;
    local_468 = psbt;
    push_bytes(&local_478,&local_480,psbt,5);
    push_psbt_key(&local_478,&local_480,0,(void *)0x0,0);
    pwVar6 = local_468;
    iVar4 = push_length_and_tx(&local_478,&local_480,local_468->tx,0xc);
    if (iVar4 == 0) {
      local_448 = len;
      local_440 = written;
      if (pwVar6->version != 0) {
        push_psbt_key(&local_478,&local_480,0xfb,(void *)0x0,0);
        push_varint(&local_478,&local_480,4);
        pwVar6 = local_468;
        push_le32(&local_478,&local_480,local_468->version);
      }
      push_map(&local_478,&local_480,&pwVar6->unknowns);
      pwVar6 = local_468;
      push_u8(&local_478,&local_480,'\0');
      if (pwVar6->num_inputs != 0) {
        lVar10 = 0;
        uVar9 = 0;
        do {
          pwVar1 = pwVar6->inputs;
          if (*(long *)((long)&pwVar1->utxo + lVar10) == 0) {
LAB_004bad3f:
            local_460 = uVar9;
            if (((local_481 & 1) == 0) &&
               (lVar2 = *(long *)((long)&pwVar1->witness_utxo + lVar10), lVar2 != 0)) {
              size = (size_t *)
                     (*(long *)(lVar2 + 0x10) +
                      *(long *)(lVar2 + 0x48) + (ulong)(*(long *)(lVar2 + 0x48) == 0) +
                      *(long *)(lVar2 + 0x38) + (ulong)(*(long *)(lVar2 + 0x38) == 0) +
                      *(long *)(lVar2 + 0x28) + (ulong)(*(long *)(lVar2 + 0x28) == 0) + 1);
              psVar5 = local_438;
              local_470 = size;
              if ((size < (size_t *)0x401) ||
                 (psVar5 = (size_t *)wally_malloc((size_t)size), psVar5 != (size_t *)0x0)) {
                local_458 = psVar5;
                local_450 = size;
                push_psbt_key(&local_478,&local_480,1,(void *)0x0,0);
                puVar8 = *(undefined1 **)(lVar2 + 0x20);
                sVar7 = *(size_t *)(lVar2 + 0x28);
                if (puVar8 == (undefined1 *)0x0) {
                  sVar7 = 1;
                }
                local_482 = 0;
                if (puVar8 == (undefined1 *)0x0) {
                  puVar8 = &local_482;
                }
                push_bytes((uchar **)&local_458,(size_t *)&local_470,puVar8,sVar7);
                puVar8 = *(undefined1 **)(lVar2 + 0x30);
                sVar7 = *(size_t *)(lVar2 + 0x38);
                if (puVar8 == (undefined1 *)0x0) {
                  sVar7 = 1;
                }
                local_482 = 0;
                if (puVar8 == (undefined1 *)0x0) {
                  puVar8 = &local_482;
                }
                push_bytes((uchar **)&local_458,(size_t *)&local_470,puVar8,sVar7);
                puVar8 = *(undefined1 **)(lVar2 + 0x40);
                sVar7 = *(size_t *)(lVar2 + 0x48);
                if (puVar8 == (undefined1 *)0x0) {
                  sVar7 = 1;
                }
                local_482 = 0;
                if (puVar8 == (undefined1 *)0x0) {
                  puVar8 = &local_482;
                }
                push_bytes((uchar **)&local_458,(size_t *)&local_470,puVar8,sVar7);
                push_varbuff((uchar **)&local_458,(size_t *)&local_470,*(uchar **)(lVar2 + 8),
                             *(size_t *)(lVar2 + 0x10));
                if (local_470 == (size_t *)0x0) {
                  push_varbuff(&local_478,&local_480,(uchar *)psVar5,(size_t)local_450);
                }
                uVar9 = local_460;
                if (psVar5 != local_438) {
                  clear_and_free(psVar5,(size_t)local_450);
                }
                bVar11 = local_470 == (size_t *)0x0;
                iVar4 = -1;
              }
              else {
                iVar4 = -3;
                bVar11 = false;
              }
              if (!bVar11) goto LAB_004bb1ee;
            }
            else if (*(long *)((long)&pwVar1->witness_utxo + lVar10) != 0) {
              local_458 = (size_t *)0x32;
              local_470 = local_438;
              push_psbt_key(&local_478,&local_480,1,(void *)0x0,0);
              push_le64((uchar **)&local_470,(size_t *)&local_458,
                        **(uint64_t **)((long)&pwVar1->witness_utxo + lVar10));
              lVar2 = *(long *)((long)&pwVar1->witness_utxo + lVar10);
              push_varbuff((uchar **)&local_470,(size_t *)&local_458,*(uchar **)(lVar2 + 8),
                           *(size_t *)(lVar2 + 0x10));
              if (local_470 == (size_t *)0x0) {
                iVar4 = -2;
                uVar9 = local_460;
                goto LAB_004bb1ee;
              }
              push_varbuff(&local_478,&local_480,(uchar *)local_438,
                           (long)local_470 - (long)local_438);
            }
            push_typed_map(&local_478,&local_480,2,
                           (wally_map *)((long)&(pwVar1->signatures).items + lVar10));
            if (*(int *)((long)&pwVar1->sighash + lVar10) != 0) {
              push_psbt_key(&local_478,&local_480,3,(void *)0x0,0);
              push_varint(&local_478,&local_480,4);
              push_le32(&local_478,&local_480,*(uint32_t *)((long)&pwVar1->sighash + lVar10));
            }
            push_typed_varbuff(&local_478,&local_480,4,
                               *(uchar **)((long)&pwVar1->redeem_script + lVar10),
                               *(size_t *)((long)&pwVar1->redeem_script_len + lVar10));
            push_typed_varbuff(&local_478,&local_480,5,
                               *(uchar **)((long)&pwVar1->witness_script + lVar10),
                               *(size_t *)((long)&pwVar1->witness_script_len + lVar10));
            push_typed_map(&local_478,&local_480,6,
                           (wally_map *)((long)&(pwVar1->keypaths).items + lVar10));
            push_typed_varbuff(&local_478,&local_480,7,
                               *(uchar **)((long)&pwVar1->final_scriptsig + lVar10),
                               *(size_t *)((long)&pwVar1->final_scriptsig_len + lVar10));
            if (*(long *)((long)&pwVar1->final_witness + lVar10) != 0) {
              local_438[0] = 0;
              push_psbt_key(&local_478,&local_480,8,(void *)0x0,0);
              push_witness_stack((uchar **)0x0,local_438,
                                 *(wally_tx_witness_stack **)((long)&pwVar1->final_witness + lVar10)
                                );
              push_varint(&local_478,&local_480,local_438[0]);
              push_witness_stack(&local_478,&local_480,
                                 *(wally_tx_witness_stack **)((long)&pwVar1->final_witness + lVar10)
                                );
            }
            if (*(int *)((long)&pwVar1->has_value + lVar10) != 0) {
              push_elements_key(&local_478,&local_480,0);
              push_varint(&local_478,&local_480,8);
              push_le64(&local_478,&local_480,*(uint64_t *)((long)&pwVar1->value + lVar10));
            }
            push_elements_varbuff
                      (&local_478,&local_480,1,*(uchar **)((long)&pwVar1->vbf + lVar10),
                       *(size_t *)((long)&pwVar1->vbf_len + lVar10));
            push_elements_varbuff
                      (&local_478,&local_480,2,*(uchar **)((long)&pwVar1->asset + lVar10),
                       *(size_t *)((long)&pwVar1->asset_len + lVar10));
            push_elements_varbuff
                      (&local_478,&local_480,3,*(uchar **)((long)&pwVar1->abf + lVar10),
                       *(size_t *)((long)&pwVar1->abf_len + lVar10));
            if (*(long *)((long)&pwVar1->pegin_tx + lVar10) != 0) {
              push_elements_key(&local_478,&local_480,4);
              iVar4 = push_length_and_tx(&local_478,&local_480,
                                         *(wally_tx **)((long)&pwVar1->pegin_tx + lVar10),1);
              uVar9 = local_460;
              if (iVar4 != 0) goto LAB_004bb1ee;
            }
            push_elements_varbuff
                      (&local_478,&local_480,5,*(uchar **)((long)&pwVar1->txoutproof + lVar10),
                       *(size_t *)((long)&pwVar1->txoutproof_len + lVar10));
            push_elements_varbuff
                      (&local_478,&local_480,6,
                       *(uchar **)((long)&pwVar1->genesis_blockhash + lVar10),
                       *(size_t *)((long)&pwVar1->genesis_blockhash_len + lVar10));
            push_elements_varbuff
                      (&local_478,&local_480,7,*(uchar **)((long)&pwVar1->claim_script + lVar10),
                       *(size_t *)((long)&pwVar1->claim_script_len + lVar10));
            push_map(&local_478,&local_480,(wally_map *)((long)&(pwVar1->unknowns).items + lVar10));
            iVar4 = 0;
            push_u8(&local_478,&local_480,'\0');
            uVar9 = local_460;
          }
          else {
            push_psbt_key(&local_478,&local_480,0,(void *)0x0,0);
            iVar4 = push_length_and_tx(&local_478,&local_480,
                                       *(wally_tx **)((long)&pwVar1->utxo + lVar10),1);
            if (iVar4 == 0) goto LAB_004bad3f;
          }
LAB_004bb1ee:
          if (iVar4 != 0) {
            return iVar4;
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x110;
          pwVar6 = local_468;
        } while (uVar9 < local_468->num_inputs);
      }
      if (pwVar6->num_outputs != 0) {
        lVar10 = 200;
        uVar9 = 0;
        do {
          pwVar3 = pwVar6->outputs;
          psVar5 = (size_t *)((long)&pwVar3->redeem_script + lVar10);
          push_typed_varbuff(&local_478,&local_480,0,(uchar *)psVar5[-0x19],psVar5[-0x18]);
          push_typed_varbuff(&local_478,&local_480,1,(uchar *)psVar5[-0x17],psVar5[-0x16]);
          push_typed_map(&local_478,&local_480,2,(wally_map *)(psVar5 + -0x15));
          push_elements_varbuff(&local_478,&local_480,0,(uchar *)psVar5[-0xd],psVar5[-0xc]);
          push_elements_varbuff(&local_478,&local_480,1,(uchar *)psVar5[-0xb],psVar5[-10]);
          push_elements_varbuff(&local_478,&local_480,2,(uchar *)psVar5[-9],psVar5[-8]);
          push_elements_varbuff(&local_478,&local_480,3,(uchar *)psVar5[-7],psVar5[-6]);
          push_elements_varbuff(&local_478,&local_480,4,(uchar *)psVar5[-3],psVar5[-2]);
          push_elements_varbuff(&local_478,&local_480,5,(uchar *)psVar5[-1],*psVar5);
          push_elements_varbuff(&local_478,&local_480,6,(uchar *)psVar5[-0xf],psVar5[-0xe]);
          push_elements_varbuff(&local_478,&local_480,7,(uchar *)psVar5[-5],psVar5[-4]);
          push_map(&local_478,&local_480,(wally_map *)((long)pwVar3 + lVar10 + -0x90));
          push_u8(&local_478,&local_480,'\0');
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0xd0;
          pwVar6 = local_468;
        } while (uVar9 < local_468->num_outputs);
      }
      sVar7 = -local_480;
      if (local_478 == (uchar *)0x0) {
        sVar7 = local_480;
      }
      *local_440 = sVar7 + local_448;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int wally_psbt_to_bytes(const struct wally_psbt *psbt, uint32_t flags,
                        unsigned char *bytes_out, size_t len,
                        size_t *written)
{
    unsigned char *cursor = bytes_out;
    size_t max = len, i, is_elements;
    uint32_t tx_flags;
    int ret;

    if (written)
        *written = 0;

    if (flags != 0 || !written)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    tx_flags = is_elements ? WALLY_TX_FLAG_USE_ELEMENTS : 0;
    push_bytes(&cursor, &max, psbt->magic, sizeof(psbt->magic));

    /* Global tx */
    push_psbt_key(&cursor, &max, PSBT_GLOBAL_UNSIGNED_TX, NULL, 0);
    ret = push_length_and_tx(&cursor, &max, psbt->tx,
                             WALLY_TX_FLAG_ALLOW_PARTIAL | WALLY_TX_FLAG_PRE_BIP144);
    if (ret != WALLY_OK)
        return ret;

    /* version */
    if (psbt->version > 0) {
        push_psbt_key(&cursor, &max, PSBT_GLOBAL_VERSION, NULL, 0);
        push_varint(&cursor, &max, sizeof(uint32_t));
        push_le32(&cursor, &max, psbt->version);
    }

    /* Unknowns */
    push_map(&cursor, &max, &psbt->unknowns);

    /* Separator */
    push_u8(&cursor, &max, PSBT_SEPARATOR);

    /* Push each input and output */
    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        if ((ret = push_psbt_input(&cursor, &max, tx_flags, input)) != WALLY_OK)
            return ret;
    }
    for (i = 0; i < psbt->num_outputs; ++i) {
        const struct wally_psbt_output *output = &psbt->outputs[i];
        if ((ret = push_psbt_output(&cursor, &max, output)) != WALLY_OK)
            return ret;
    }

    if (cursor == NULL) {
        /* Once cursor is NULL, max holds how many bytes we needed */
        *written = len + max;
    } else {
        *written = len - max;
    }

    return WALLY_OK;
}